

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void AddFilesFromDirectoryToTpaList(char *directory,string *tpaList)

{
  uchar uVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  iterator iVar5;
  long lVar6;
  uint uVar7;
  string filenameWithoutExt;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedAssemblies;
  string filename;
  key_type local_138;
  char *local_118;
  long local_110;
  char *local_108;
  char *local_100;
  size_t local_f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  stat local_c0;
  
  local_118 = directory;
  __dirp = opendir(directory);
  if (__dirp != (DIR *)0x0) {
    local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_f0._M_impl.super__Rb_tree_header._M_header;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lVar6 = 0;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_100 = (char *)(&DAT_00105d70)[lVar6];
      local_110 = lVar6;
      local_f8 = strlen(local_100);
      local_108 = (char *)(long)(int)local_f8;
LAB_001024c8:
      pdVar3 = readdir(__dirp);
      if (pdVar3 != (dirent *)0x0) {
        uVar1 = pdVar3->d_type;
        if (uVar1 == '\0') goto LAB_001024f2;
        if (uVar1 != '\b') goto code_r0x001024ed;
        goto LAB_00102585;
      }
      rewinddir(__dirp);
      lVar6 = local_110 + 1;
    } while (lVar6 != 4);
    closedir(__dirp);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_f0);
  }
  return;
code_r0x001024ed:
  if (uVar1 == '\n') {
LAB_001024f2:
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&local_138);
    std::__cxx11::string::append((char *)&local_138);
    std::__cxx11::string::append((char *)&local_138);
    iVar2 = stat(local_138._M_dataplus._M_p,&local_c0);
    uVar7 = local_c0.st_mode & 0xf000;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
    if ((iVar2 != -1) && (uVar7 == 0x8000)) {
LAB_00102585:
      local_c0.st_dev = (__dev_t)&local_c0.st_nlink;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,pdVar3->d_name,pdVar3->d_name + sVar4);
      uVar7 = (int)local_c0.st_ino - (int)local_f8;
      if (0 < (int)uVar7) {
        iVar2 = std::__cxx11::string::compare
                          ((ulong)&local_c0,(ulong)(uVar7 & 0x7fffffff),local_108);
        if (iVar2 == 0) {
          std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_c0);
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_f0,&local_138);
          if ((_Rb_tree_header *)iVar5._M_node == &local_f0._M_impl.super__Rb_tree_header) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_f0,&local_138);
            std::__cxx11::string::append((char *)tpaList);
            std::__cxx11::string::append((char *)tpaList);
            std::__cxx11::string::_M_append((char *)tpaList,local_c0.st_dev);
            std::__cxx11::string::append((char *)tpaList);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,
                            CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                     local_138.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
        operator_delete((void *)local_c0.st_dev,local_c0.st_nlink + 1);
      }
    }
  }
  goto LAB_001024c8;
}

Assistant:

void AddFilesFromDirectoryToTpaList(const char *directory,
                                    std::string &tpaList) {
  const char *const tpaExtensions[] = {
      ".ni.dll", // Probe for .ni.dll first so that it's preferred if ni and il
                 // coexist in the same dir
      ".dll",
      ".ni.exe",
      ".exe",
  };

  DIR *dir = opendir(directory);
  if (dir == nullptr) {
    return;
  }

  std::set<std::string> addedAssemblies;

  // Walk the directory for each extension separately so that we first get files
  // with .ni.dll extension, then files with .dll extension, etc.
  for (int extIndex = 0;
       extIndex < sizeof(tpaExtensions) / sizeof(tpaExtensions[0]);
       extIndex++) {
    const char *ext = tpaExtensions[extIndex];
    int extLength = strlen(ext);

    struct dirent *entry;

    // For all entries in the directory
    while ((entry = readdir(dir)) != nullptr) {
      // We are interested in files only
      switch (entry->d_type) {
      case DT_REG:
        break;

      // Handle symlinks and file systems that do not support d_type
      case DT_LNK:
      case DT_UNKNOWN: {
        std::string fullFilename;

        fullFilename.append(directory);
        fullFilename.append("/");
        fullFilename.append(entry->d_name);

        struct stat sb;
        if (stat(fullFilename.c_str(), &sb) == -1) {
          continue;
        }

        if (!S_ISREG(sb.st_mode)) {
          continue;
        }
      } break;

      default:
        continue;
      }

      std::string filename(entry->d_name);

      // Check if the extension matches the one we are looking for
      int extPos = filename.length() - extLength;
      if ((extPos <= 0) || (filename.compare(extPos, extLength, ext) != 0)) {
        continue;
      }

      std::string filenameWithoutExt(filename.substr(0, extPos));

      // Make sure if we have an assembly with multiple extensions present,
      // we insert only one version of it.
      if (addedAssemblies.find(filenameWithoutExt) == addedAssemblies.end()) {
        addedAssemblies.insert(filenameWithoutExt);

        tpaList.append(directory);
        tpaList.append("/");
        tpaList.append(filename);
        tpaList.append(":");
      }
    }

    // Rewind the directory stream to be able to iterate over it for the next
    // extension
    rewinddir(dir);
  }

  closedir(dir);
}